

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O2

PC * __thiscall
Hpipe::Context::forward(PC *__return_storage_ptr__,Context *this,int type,bool never_ending)

{
  pointer ppCVar1;
  CharItem *item;
  pointer pCVar2;
  bool bVar3;
  uint ind;
  pointer pCVar4;
  PcMaker pm;
  
  anon_unknown_7::PcMaker::PcMaker(&pm,this);
  ind = 0;
  do {
    ppCVar1 = (this->pos).
              super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
              super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->pos).
                      super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                      .
                      super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar1 >> 3) <= (ulong)ind
       ) {
      std::pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_>::pair(__return_storage_ptr__,&pm.res);
LAB_0014e4b6:
      std::pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_>::~pair(&pm.res);
      return __return_storage_ptr__;
    }
    item = ppCVar1[ind];
    if (item->type == type) {
      pCVar2 = (item->edges).super_vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>.
               super__Vector_base<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pCVar4 = (item->edges).super_vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>.
                    super__Vector_base<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>._M_impl.
                    super__Vector_impl_data._M_start; pCVar4 != pCVar2; pCVar4 = pCVar4 + 1) {
        bVar3 = anon_unknown_7::PcMaker::has(&pm,pCVar4->item);
        if (!bVar3) {
          anon_unknown_7::PcMaker::add(&pm,pCVar4->item,ind,true);
          bVar3 = CharGraph::leads_to_ok((Vec<const_Hpipe::CharItem_*> *)&pm,never_ending);
          if (bVar3) {
            std::pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_>::pair
                      (__return_storage_ptr__,&pm.res);
            goto LAB_0014e4b6;
          }
        }
      }
    }
    else {
      bVar3 = anon_unknown_7::PcMaker::has(&pm,item);
      if (!bVar3) {
        anon_unknown_7::PcMaker::add(&pm,item,ind,true);
        bVar3 = CharGraph::leads_to_ok((Vec<const_Hpipe::CharItem_*> *)&pm,never_ending);
        if (bVar3) {
          std::pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_>::pair(__return_storage_ptr__,&pm.res)
          ;
          goto LAB_0014e4b6;
        }
      }
    }
    ind = ind + 1;
  } while( true );
}

Assistant:

Context::PC Context::forward( int type, bool never_ending ) const {
    PcMaker pm( this );

    for( unsigned i = 0; i < pos.size(); ++i ) {
        const CharItem *item = pos[ i ];
        if ( item->type == type ) {
            for( const CharEdge &e : item->edges ) {
                if ( not pm.has( e.item ) ) {
                    pm.add( e.item, i );
                    if ( pm.leads_to_ok( never_ending ) )
                        return pm.out();
                }
            }
        } else if ( not pm.has( item ) ) {
            pm.add( item, i );
            if ( pm.leads_to_ok( never_ending ) )
                return pm.out();
        }
    }

    return pm.out();
}